

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# status.cc
# Opt level: O2

void __thiscall
StatusPrinter::BuildEdgeFinished
          (StatusPrinter *this,Edge *edge,int64_t end_time_millis,bool success,string *output)

{
  LinePrinter *this_00;
  bool bVar1;
  pointer ppNVar2;
  string outputs;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_98;
  string *local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  this->time_millis_ = end_time_millis;
  this->finished_edges_ = this->finished_edges_ + 1;
  bVar1 = Edge::use_console(edge);
  if (bVar1) {
    LinePrinter::SetConsoleLocked(&this->printer_,false);
  }
  if (*(int *)this->config_ != 0) {
    bVar1 = Edge::use_console(edge);
    if (!bVar1) {
      PrintStatus(this,edge,end_time_millis);
    }
    this->running_edges_ = this->running_edges_ + -1;
    if (!success) {
      local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
      local_50._M_string_length = 0;
      local_50.field_2._M_local_buf[0] = '\0';
      local_78 = output;
      for (ppNVar2 = (edge->outputs_).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
                     super__Vector_impl_data._M_start;
          ppNVar2 !=
          (edge->outputs_).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
          super__Vector_impl_data._M_finish; ppNVar2 = ppNVar2 + 1) {
        std::operator+(&bStack_98,&(*ppNVar2)->path_," ");
        std::__cxx11::string::append((string *)&local_50);
        std::__cxx11::string::~string((string *)&bStack_98);
      }
      this_00 = &this->printer_;
      if ((this->printer_).supports_color_ == false) {
        std::operator+(&local_70,"FAILED: ",&local_50);
        output = local_78;
        std::operator+(&bStack_98,&local_70,"\n");
        LinePrinter::PrintOnNewLine(this_00,&bStack_98);
      }
      else {
        std::operator+(&local_70,"\x1b[31mFAILED: \x1b[0m",&local_50);
        output = local_78;
        std::operator+(&bStack_98,&local_70,"\n");
        LinePrinter::PrintOnNewLine(this_00,&bStack_98);
      }
      std::__cxx11::string::~string((string *)&bStack_98);
      std::__cxx11::string::~string((string *)&local_70);
      Edge::EvaluateCommand_abi_cxx11_(&local_70,edge,false);
      std::operator+(&bStack_98,&local_70,"\n");
      LinePrinter::PrintOnNewLine(this_00,&bStack_98);
      std::__cxx11::string::~string((string *)&bStack_98);
      std::__cxx11::string::~string((string *)&local_70);
      std::__cxx11::string::~string((string *)&local_50);
    }
    if (output->_M_string_length != 0) {
      local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
      local_50._M_string_length = 0;
      local_50.field_2._M_local_buf[0] = '\0';
      if ((this->printer_).supports_color_ == false) {
        StripAnsiEscapeCodes(&bStack_98,output);
        std::__cxx11::string::operator=((string *)&local_50,(string *)&bStack_98);
        std::__cxx11::string::~string((string *)&bStack_98);
      }
      else {
        std::__cxx11::string::_M_assign((string *)&local_50);
      }
      LinePrinter::PrintOnNewLine(&this->printer_,&local_50);
      std::__cxx11::string::~string((string *)&local_50);
    }
  }
  return;
}

Assistant:

void StatusPrinter::BuildEdgeFinished(Edge* edge, int64_t end_time_millis,
                                      bool success, const string& output) {
  time_millis_ = end_time_millis;
  ++finished_edges_;

  if (edge->use_console())
    printer_.SetConsoleLocked(false);

  if (config_.verbosity == BuildConfig::QUIET)
    return;

  if (!edge->use_console())
    PrintStatus(edge, end_time_millis);

  --running_edges_;

  // Print the command that is spewing before printing its output.
  if (!success) {
    string outputs;
    for (vector<Node*>::const_iterator o = edge->outputs_.begin();
         o != edge->outputs_.end(); ++o)
      outputs += (*o)->path() + " ";

    if (printer_.supports_color()) {
        printer_.PrintOnNewLine("\x1B[31m" "FAILED: " "\x1B[0m" + outputs + "\n");
    } else {
        printer_.PrintOnNewLine("FAILED: " + outputs + "\n");
    }
    printer_.PrintOnNewLine(edge->EvaluateCommand() + "\n");
  }

  if (!output.empty()) {
    // ninja sets stdout and stderr of subprocesses to a pipe, to be able to
    // check if the output is empty. Some compilers, e.g. clang, check
    // isatty(stderr) to decide if they should print colored output.
    // To make it possible to use colored output with ninja, subprocesses should
    // be run with a flag that forces them to always print color escape codes.
    // To make sure these escape codes don't show up in a file if ninja's output
    // is piped to a file, ninja strips ansi escape codes again if it's not
    // writing to a |smart_terminal_|.
    // (Launching subprocesses in pseudo ttys doesn't work because there are
    // only a few hundred available on some systems, and ninja can launch
    // thousands of parallel compile commands.)
    string final_output;
    if (!printer_.supports_color())
      final_output = StripAnsiEscapeCodes(output);
    else
      final_output = output;

#ifdef _WIN32
    // Fix extra CR being added on Windows, writing out CR CR LF (#773)
    _setmode(_fileno(stdout), _O_BINARY);  // Begin Windows extra CR fix
#endif

    printer_.PrintOnNewLine(final_output);

#ifdef _WIN32
    _setmode(_fileno(stdout), _O_TEXT);  // End Windows extra CR fix
#endif
  }
}